

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse::addRef
          (LocallyRedirectedRpcResponse *this)

{
  RpcResponse *extraout_RDX;
  _func_int **in_RSI;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t> OVar1;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
  local_18;
  
  *(int *)(in_RSI + 3) = *(int *)(in_RSI + 3) + 1;
  local_18.disposer = (Disposer *)(in_RSI + 2);
  (this->super_RpcResponse).super_ResponseHook._vptr_ResponseHook = (_func_int **)local_18.disposer;
  (this->super_RpcServerResponse)._vptr_RpcServerResponse = in_RSI;
  local_18.ptr = (LocallyRedirectedRpcResponse *)0x0;
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
  ::dispose(&local_18);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<RpcResponse> addRef() override {
      return kj::addRef(*this);
    }